

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<unsigned_long_long>
          (arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,unsigned_long_long value,format_specs *spec)

{
  byte bVar1;
  undefined1 auStack_40 [8];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> w;
  
  auStack_40 = (undefined1  [8])
               (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  w.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)(this->locale_).locale_;
  w.abs_value._4_4_ = 0;
  bVar1 = (byte)spec->field_0x9 >> 4 & 7;
  if (1 < bVar1) {
    w.abs_value._0_1_ = 0x20;
    if (bVar1 == 2) {
      w.abs_value._0_1_ = 0x2b;
    }
    w.abs_value._4_4_ = 1;
  }
  w.locale.locale_ = spec;
  w.specs = (basic_format_specs<char> *)value;
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>&>
            (spec->type,
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *)auStack_40);
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)auStack_40;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }